

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acesup.c
# Opt level: O0

MovePack * acesup_movePackGet(Board *board)

{
  byte *pbVar1;
  code *pcVar2;
  Spot *pSVar3;
  unsigned_long uVar4;
  Board *in_RDI;
  Card *card;
  uchar suitTopRanks [4];
  Spot *tableaus [4];
  Spot *stock;
  uchar j;
  uchar i;
  MovePack *movePack;
  undefined4 uVar5;
  undefined4 in_stack_ffffffffffffff5c;
  MovePack *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  MovePack *in_stack_ffffffffffffff70;
  long in_stack_ffffffffffffff80;
  uint local_74;
  byte local_4c [4];
  long alStack_48 [5];
  Spot *local_20;
  byte local_12;
  byte local_11;
  MovePack *local_10;
  Board *local_8;
  
  local_8 = in_RDI;
  local_10 = movePack_create();
  local_20 = board_spotGet(local_8,STOCK,'\0');
  memset(local_4c,0,4);
  local_11 = 0;
  do {
    if (3 < local_11) {
      local_11 = 0;
      do {
        if (3 < local_11) {
          for (local_11 = 0; local_11 < 4; local_11 = local_11 + 1) {
            if (*(char *)(alStack_48[local_11] + 2) != '\0') {
              for (local_12 = 0; local_12 < 4; local_12 = local_12 + 1) {
                if ((local_11 != local_12) && (*(char *)(alStack_48[local_12] + 2) == '\0')) {
                  uVar5 = 0xffffffff;
                  in_stack_ffffffffffffff70 = local_10;
                  move_create((MOVETYPE)((ulong)local_10 >> 0x38),
                              (SPOTTYPE)((ulong)local_10 >> 0x30),(uchar)((ulong)local_10 >> 0x28),
                              (int)local_10,(SPOTTYPE)((ulong)in_stack_ffffffffffffff68 >> 0x38),
                              (uchar)((ulong)in_stack_ffffffffffffff68 >> 0x30),
                              (int)in_stack_ffffffffffffff80);
                  movePack_add(in_stack_ffffffffffffff60,
                               (Move *)CONCAT44(in_stack_ffffffffffffff5c,uVar5));
                }
              }
            }
          }
          if (local_20->cardsCount != '\0') {
            uVar5 = 0xffffffff;
            move_create((MOVETYPE)((ulong)in_stack_ffffffffffffff70 >> 0x38),
                        (SPOTTYPE)((ulong)in_stack_ffffffffffffff70 >> 0x30),
                        (uchar)((ulong)in_stack_ffffffffffffff70 >> 0x28),
                        (int)in_stack_ffffffffffffff70,(SPOTTYPE)((ulong)local_10 >> 0x38),
                        (uchar)((ulong)local_10 >> 0x30),(int)in_stack_ffffffffffffff80);
            movePack_add(in_stack_ffffffffffffff60,(Move *)CONCAT44(in_stack_ffffffffffffff5c,uVar5)
                        );
          }
          return local_10;
        }
        if (*(char *)(alStack_48[local_11] + 2) != '\0') {
          in_stack_ffffffffffffff80 = *(long *)(alStack_48[local_11] + 8);
          if (SBORROW4((uint)*(byte *)(alStack_48[local_11] + 2),1)) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          pbVar1 = *(byte **)(in_stack_ffffffffffffff80 +
                             (long)(int)(*(byte *)(alStack_48[local_11] + 2) - 1) * 8);
          for (local_12 = 0; local_12 < 4; local_12 = local_12 + 1) {
            if (((*pbVar1 != 1) && (pbVar1[1] == local_12)) && (*pbVar1 < local_4c[local_12])) {
              uVar5 = 0xffffffff;
              move_create((MOVETYPE)((ulong)in_stack_ffffffffffffff70 >> 0x38),
                          (SPOTTYPE)((ulong)in_stack_ffffffffffffff70 >> 0x30),
                          (uchar)((ulong)in_stack_ffffffffffffff70 >> 0x28),
                          (int)in_stack_ffffffffffffff70,
                          (SPOTTYPE)((ulong)in_stack_ffffffffffffff68 >> 0x38),
                          (uchar)((ulong)in_stack_ffffffffffffff68 >> 0x30),
                          (int)in_stack_ffffffffffffff80);
              movePack_add(in_stack_ffffffffffffff60,
                           (Move *)CONCAT44(in_stack_ffffffffffffff5c,uVar5));
            }
          }
        }
        local_11 = local_11 + 1;
      } while( true );
    }
    pSVar3 = board_spotGet(local_8,TABLEAU,local_11);
    alStack_48[local_11] = (long)pSVar3;
    if (*(char *)(alStack_48[local_11] + 2) != '\0') {
      if (SBORROW4((uint)*(byte *)(alStack_48[local_11] + 2),1)) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      pbVar1 = *(byte **)(*(long *)(alStack_48[local_11] + 8) +
                         (long)(int)(*(byte *)(alStack_48[local_11] + 2) - 1) * 8);
      for (local_12 = 0; local_12 < 4; local_12 = local_12 + 1) {
        if (pbVar1[1] == local_12) {
          if (*pbVar1 == 1) {
            local_74 = 0xe;
          }
          else {
            local_74 = (uint)*pbVar1;
          }
          uVar4 = max((ulong)local_4c[local_12],(long)(int)local_74);
          local_4c[local_12] = (byte)uVar4;
        }
      }
    }
    local_11 = local_11 + 1;
  } while( true );
}

Assistant:

MovePack * acesup_movePackGet(Board * board)
{
	MovePack * movePack = movePack_create();
	unsigned char i, j;
	Spot * stock = board_spotGet(board, STOCK, 0);
	Spot * tableaus[4];
	unsigned char suitTopRanks[4] = {0,0,0,0};
	Card * card;

	for(i=0;i<4;i++)
	{
		tableaus[i] = board_spotGet(board, TABLEAU, i);
		if(tableaus[i]->cardsCount<1)
			continue;

		card = tableaus[i]->cards[tableaus[i]->cardsCount-1];
		for(j=0;j<4;j++)
		{
			if(card->suit==j)
				suitTopRanks[j] = max(suitTopRanks[j], (card->rank==1 ? 14 : card->rank));
		}
	}

	// Play card to foundation
	for(i=0;i<4;i++)
	{
		if(tableaus[i]->cardsCount<1)
			continue;

		card = tableaus[i]->cards[tableaus[i]->cardsCount-1];
		for(j=0;j<4;j++)
		{
			if(card->rank!=1 && card->suit==j && card->rank<suitTopRanks[j])
				movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, FOUNDATION, 0, -1));
		}
	}

	// Tableau to Tableau
	for(i=0;i<4;i++)
	{
		if(tableaus[i]->cardsCount<1)
			continue;

		for(j=0;j<4;j++)
		{
			if(i==j || tableaus[j]->cardsCount>0)
				continue;

			movePack_add(movePack, move_create(MOVE, TABLEAU, i, -1, TABLEAU, j, -1));
		}
	}

	// Play stock to tableau
	if(stock->cardsCount>0)
		movePack_add(movePack, move_create(MOVEDISTRIBUTE, STOCK, 0, -1, TABLEAU, 4, -1));

	return movePack;
}